

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_optimization.cc
# Opt level: O2

void __thiscall QPDF::filterCompressedObjects(QPDF *this,ObjTable *obj)

{
  _Rb_tree_node_base *__v;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  QPDFObjGen og;
  QPDFObjGen og_00;
  QPDFObjGen og_01;
  QPDFObjGen og_02;
  _Base_ptr p_Var2;
  QPDF *pQVar3;
  bool bVar4;
  Object *pOVar5;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  *this_00;
  _Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
  *this_01;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  _Rb_tree<QPDF::ObjUser,QPDF::ObjUser,std::_Identity<QPDF::ObjUser>,std::less<QPDF::ObjUser>,std::allocator<QPDF::ObjUser>>
  *p_Var8;
  ObjUser *ou;
  map<QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
  t_obj_user_to_objects;
  map<QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>_>
  t_object_to_obj_users;
  QPDFObjGen local_b0;
  _Rb_tree_node_base *local_a8;
  _Base_ptr local_a0;
  QPDF *local_98;
  _Rb_tree<QPDF::ObjUser,_std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>,_std::_Select1st<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
  local_90;
  _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>_>
  local_60;
  
  if (obj->streams_empty == false) {
    local_90._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_90._M_impl.super__Rb_tree_header._M_header;
    local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Var1._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    local_a0 = (_Base_ptr)((long)&(_Var1._M_head_impl)->obj_user_to_objects + 8);
    p_Var7 = *(_Base_ptr *)((long)&(_Var1._M_head_impl)->obj_user_to_objects + 0x18);
    local_98 = this;
    local_90._M_impl.super__Rb_tree_header._M_header._M_right =
         local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    while (p_Var7 != local_a0) {
      local_a8 = p_Var7;
      for (p_Var6 = *(_Rb_tree_node_base **)(p_Var7 + 3);
          p_Var6 != (_Rb_tree_node_base *)&p_Var7[2]._M_left;
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        og.obj = p_Var6[1]._M_color;
        og.gen = *(int *)&p_Var6[1].field_0x4;
        bVar4 = ObjTable<QPDFWriter::Object>::contains(&obj->super_ObjTable<QPDFWriter::Object>,og);
        if (bVar4) {
          __v = p_Var6 + 1;
          og_00.obj = __v->_M_color;
          og_00.gen = *(int *)&__v->field_0x4;
          pOVar5 = ObjTable<QPDFWriter::Object>::operator[]
                             (&obj->super_ObjTable<QPDFWriter::Object>,og_00);
          if (pOVar5->object_stream < 1) {
            this_01 = (_Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
                       *)std::
                         map<QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                         ::operator[]((map<QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                                       *)&local_90,(key_type *)(p_Var7 + 1));
            std::
            _Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
            ::_M_insert_unique<QPDFObjGen_const&>(this_01,(QPDFObjGen *)__v);
          }
          else {
            this_00 = &std::
                       map<QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                       ::operator[]((map<QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                                     *)&local_90,(key_type *)(p_Var7 + 1))->_M_t;
            local_b0.obj = pOVar5->object_stream;
            local_b0.gen = 0;
            std::
            _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
            ::_M_insert_unique<QPDFObjGen>(this_00,&local_b0);
          }
        }
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(local_a8);
    }
    _Var1._M_head_impl =
         (local_98->m)._M_t.
         super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    local_a0 = (_Base_ptr)((long)&(_Var1._M_head_impl)->object_to_obj_users + 8);
    p_Var7 = *(_Base_ptr *)((long)&(_Var1._M_head_impl)->object_to_obj_users + 0x18);
    while (pQVar3 = local_98, p_Var7 != local_a0) {
      og_01.obj = p_Var7[1]._M_color;
      og_01.gen = *(int *)&p_Var7[1].field_0x4;
      local_a8 = p_Var7;
      bVar4 = ObjTable<QPDFWriter::Object>::contains(&obj->super_ObjTable<QPDFWriter::Object>,og_01)
      ;
      if (bVar4) {
        p_Var7 = local_a8 + 1;
        p_Var2 = local_a8 + 1;
        for (p_Var6 = *(_Rb_tree_node_base **)(local_a8 + 2);
            p_Var6 != (_Rb_tree_node_base *)&p_Var2->_M_left;
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
          og_02.obj = p_Var7->_M_color;
          og_02.gen = *(int *)&p_Var7->field_0x4;
          pOVar5 = ObjTable<QPDFWriter::Object>::operator[]
                             (&obj->super_ObjTable<QPDFWriter::Object>,og_02);
          if (pOVar5->object_stream < 1) {
            p_Var8 = (_Rb_tree<QPDF::ObjUser,QPDF::ObjUser,std::_Identity<QPDF::ObjUser>,std::less<QPDF::ObjUser>,std::allocator<QPDF::ObjUser>>
                      *)std::
                        map<QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>_>
                        ::operator[]((map<QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>_>
                                      *)&local_60,(key_type *)p_Var7);
            std::
            _Rb_tree<QPDF::ObjUser,QPDF::ObjUser,std::_Identity<QPDF::ObjUser>,std::less<QPDF::ObjUser>,std::allocator<QPDF::ObjUser>>
            ::_M_insert_unique<QPDF::ObjUser_const&>(p_Var8,(ObjUser *)(p_Var6 + 1));
          }
          else {
            local_b0.gen = 0;
            local_b0.obj = pOVar5->object_stream;
            p_Var8 = (_Rb_tree<QPDF::ObjUser,QPDF::ObjUser,std::_Identity<QPDF::ObjUser>,std::less<QPDF::ObjUser>,std::allocator<QPDF::ObjUser>>
                      *)std::
                        map<QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>_>
                        ::operator[]((map<QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>_>
                                      *)&local_60,&local_b0);
            std::
            _Rb_tree<QPDF::ObjUser,QPDF::ObjUser,std::_Identity<QPDF::ObjUser>,std::less<QPDF::ObjUser>,std::allocator<QPDF::ObjUser>>
            ::_M_insert_unique<QPDF::ObjUser_const&>(p_Var8,(ObjUser *)(p_Var6 + 1));
          }
        }
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(local_a8);
    }
    std::
    _Rb_tree<QPDF::ObjUser,_std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>,_std::_Select1st<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
    ::operator=(&(((local_98->m)._M_t.
                   super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                   super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->obj_user_to_objects)
                 ._M_t,&local_90);
    std::
    _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>_>
    ::operator=(&(((pQVar3->m)._M_t.
                   super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                   super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->object_to_obj_users)
                 ._M_t,&local_60);
    std::
    _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>_>
    ::~_Rb_tree(&local_60);
    std::
    _Rb_tree<QPDF::ObjUser,_std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>,_std::_Select1st<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
    ::~_Rb_tree(&local_90);
  }
  return;
}

Assistant:

void
QPDF::filterCompressedObjects(QPDFWriter::ObjTable const& obj)
{
    if (obj.getStreamsEmpty()) {
        return;
    }

    // Transform object_to_obj_users and obj_user_to_objects so that they refer only to uncompressed
    // objects.  If something is a user of a compressed object, then it is really a user of the
    // object stream that contains it.

    std::map<ObjUser, std::set<QPDFObjGen>> t_obj_user_to_objects;
    std::map<QPDFObjGen, std::set<ObjUser>> t_object_to_obj_users;

    for (auto const& i1: m->obj_user_to_objects) {
        ObjUser const& ou = i1.first;
        // Loop over objects.
        for (auto const& og: i1.second) {
            if (obj.contains(og)) {
                if (auto const& i2 = obj[og].object_stream; i2 <= 0) {
                    t_obj_user_to_objects[ou].insert(og);
                } else {
                    t_obj_user_to_objects[ou].insert(QPDFObjGen(i2, 0));
                }
            }
        }
    }

    for (auto const& i1: m->object_to_obj_users) {
        QPDFObjGen const& og = i1.first;
        if (obj.contains(og)) {
            // Loop over obj_users.
            for (auto const& ou: i1.second) {
                if (auto i2 = obj[og].object_stream; i2 <= 0) {
                    t_object_to_obj_users[og].insert(ou);
                } else {
                    t_object_to_obj_users[QPDFObjGen(i2, 0)].insert(ou);
                }
            }
        }
    }

    m->obj_user_to_objects = t_obj_user_to_objects;
    m->object_to_obj_users = t_object_to_obj_users;
}